

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O0

vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
* __thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::uncovered
          (DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *this,IntervalT *I)

{
  initializer_list<dg::ADT::DiscreteInterval<dg::Offset>_> __l;
  initializer_list<dg::ADT::DiscreteInterval<dg::Offset>_> __l_00;
  initializer_list<dg::ADT::DiscreteInterval<dg::Offset>_> __l_01;
  bool bVar1;
  pointer ppVar2;
  type *in_RDX;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  *in_RDI;
  IntervalT cur;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  ret;
  const_iterator it;
  value_type *in_stack_fffffffffffffe88;
  IntervalT *in_stack_fffffffffffffe90;
  Offset in_stack_fffffffffffffe98;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  *in_stack_fffffffffffffea0;
  iterator in_stack_fffffffffffffea8;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  *this_00;
  size_type in_stack_fffffffffffffeb0;
  Offset *pOVar3;
  _Self local_128;
  Offset local_120;
  type local_118;
  Offset local_110;
  type local_108;
  Offset local_100;
  DiscreteInterval<dg::Offset> local_f8;
  pointer local_e0;
  pointer local_d8;
  pointer *local_d0;
  undefined8 local_c8;
  _Self local_c0;
  Offset local_b8;
  type local_b0;
  undefined4 local_a4;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  local_a0 [2];
  type local_70;
  type local_68;
  type *local_60;
  undefined8 local_58;
  _Self local_50;
  _Self local_48 [2];
  type local_38;
  type local_30;
  type *local_28;
  undefined8 local_20;
  type *local_18;
  
  local_18 = in_RDX;
  bVar1 = std::
          map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
          ::empty((map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
                   *)0x181f6e);
  if (bVar1) {
    local_38 = *local_18;
    local_30 = local_18[1];
    local_28 = &local_38;
    local_20 = 1;
    std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>::allocator
              ((allocator<dg::ADT::DiscreteInterval<dg::Offset>_> *)0x181fbc);
    __l._M_len = in_stack_fffffffffffffeb0;
    __l._M_array = in_stack_fffffffffffffea8;
    std::
    vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
    ::vector(in_stack_fffffffffffffea0,__l,(allocator_type *)in_stack_fffffffffffffe98.offset);
    std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>::~allocator
              ((allocator<dg::ADT::DiscreteInterval<dg::Offset>_> *)0x181feb);
    return in_RDI;
  }
  local_48[0]._M_node =
       (_Base_ptr)
       le((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)in_stack_fffffffffffffe98.offset,
          in_stack_fffffffffffffe90);
  local_50._M_node =
       (_Base_ptr)
       end((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)in_stack_fffffffffffffe88);
  bVar1 = std::operator==(local_48,&local_50);
  if (bVar1) {
    local_70 = *local_18;
    local_68 = local_18[1];
    local_60 = &local_70;
    local_58 = 1;
    std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>::allocator
              ((allocator<dg::ADT::DiscreteInterval<dg::Offset>_> *)0x18207f);
    __l_00._M_len = in_stack_fffffffffffffeb0;
    __l_00._M_array = in_stack_fffffffffffffea8;
    std::
    vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
    ::vector(in_stack_fffffffffffffea0,__l_00,(allocator_type *)in_stack_fffffffffffffe98.offset);
    std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>::~allocator
              ((allocator<dg::ADT::DiscreteInterval<dg::Offset>_> *)0x1820ae);
    return in_RDI;
  }
  std::
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  ::vector((vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
            *)0x1820c0);
  local_a0[0].
  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)*local_18;
  local_a0[0].
  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_18[1];
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                         *)0x1820f9);
  bVar1 = Offset::operator>((Offset *)local_a0,(Offset *)ppVar2);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                           *)0x18211c);
    bVar1 = Offset::operator>=(&(ppVar2->first).end,(Offset *)(local_18 + 1));
    if (bVar1) {
      memset(in_RDI,0,0x18);
      std::
      vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      ::vector((vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                *)0x182155);
      goto LAB_0018247d;
    }
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                           *)0x182172);
    pOVar3 = &(ppVar2->first).end;
    Offset::Offset(&local_b8,1);
    local_b0 = (type)Offset::operator+(&in_stack_fffffffffffffe90->start,in_stack_fffffffffffffe98);
    Offset::operator=((Offset *)local_a0,(Offset)local_b0);
    std::
    _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                  *)in_stack_fffffffffffffe90);
    local_c0._M_node =
         (_Base_ptr)
         std::
         map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
         ::end((map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
                *)in_stack_fffffffffffffe88);
    bVar1 = std::operator==(local_48,&local_c0);
    if ((bVar1) &&
       (bVar1 = Offset::operator<=((Offset *)local_a0,
                                   (Offset *)
                                   &local_a0[0].
                                    super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish), bVar1)) {
      local_e0 = local_a0[0].
                 super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_d8 = local_a0[0].
                 super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      local_d0 = &local_e0;
      local_c8 = 1;
      std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>::allocator
                ((allocator<dg::ADT::DiscreteInterval<dg::Offset>_> *)0x182264);
      __l_01._M_len = (size_type)pOVar3;
      __l_01._M_array = in_stack_fffffffffffffea8;
      std::
      vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      ::vector(in_stack_fffffffffffffea0,__l_01,(allocator_type *)in_stack_fffffffffffffe98.offset);
      std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>::~allocator
                ((allocator<dg::ADT::DiscreteInterval<dg::Offset>_> *)0x182293);
      goto LAB_0018247d;
    }
  }
  do {
    this_00 = local_a0;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                           *)0x1822c5);
    bVar1 = Offset::operator!=((Offset *)this_00,(Offset *)ppVar2);
    if (bVar1) {
      in_stack_fffffffffffffea0 = local_a0;
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                             *)0x1822f5);
      bVar1 = Offset::operator<((Offset *)in_stack_fffffffffffffea0,(Offset *)ppVar2);
      if (bVar1) {
        local_100.offset =
             (type)local_a0[0].
                   super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        in_stack_fffffffffffffe98.offset =
             (type)std::
                   _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                   ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                                 *)0x182322);
        Offset::Offset(&local_110,1);
        local_108 = (type)Offset::operator-(in_stack_fffffffffffffe98.offset,
                                            &in_stack_fffffffffffffe90->start);
        DiscreteInterval<dg::Offset>::DiscreteInterval(&local_f8,local_100,(Offset)local_108);
        std::
        vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
        ::push_back((vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                     *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      }
    }
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                           *)0x182383);
    bVar1 = Offset::operator>=(&(ppVar2->first).end,(Offset *)(local_18 + 1));
    if (bVar1) goto LAB_00182460;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                           *)0x1823b3);
    in_stack_fffffffffffffe90 = (IntervalT *)&(ppVar2->first).end;
    Offset::Offset(&local_120,1);
    local_118 = (type)Offset::operator+(&in_stack_fffffffffffffe90->start,in_stack_fffffffffffffe98)
    ;
    Offset::operator=((Offset *)local_a0,(Offset)local_118);
    std::
    _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                  *)in_stack_fffffffffffffe90);
    local_128._M_node =
         (_Base_ptr)
         end((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)in_stack_fffffffffffffe88);
    bVar1 = std::operator==(local_48,&local_128);
  } while (!bVar1);
  bVar1 = Offset::operator<=((Offset *)local_a0,
                             (Offset *)
                             &local_a0[0].
                              super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
  if (bVar1) {
    std::
    vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
    ::push_back(in_stack_fffffffffffffea0,(value_type *)in_stack_fffffffffffffe98.offset);
  }
LAB_00182460:
  std::
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  ::vector((vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
            *)in_stack_fffffffffffffe90,
           (vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
            *)in_stack_fffffffffffffe88);
LAB_0018247d:
  local_a4 = 1;
  std::
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  ::~vector(in_stack_fffffffffffffea0);
  return in_RDI;
}

Assistant:

std::vector<IntervalT> uncovered(const IntervalT &I) const {
        if (_mapping.empty())
            return {I};

        auto it = le(I);
        if (it == end())
            return {I};

        std::vector<IntervalT> ret;
        IntervalT cur = I;

        if (cur.start > it->first.start) {
            // the first interval covers the whole I?
            if (it->first.end >= I.end) {
                return {};
            }

            assert(cur == I);
            cur.start = it->first.end + 1;
            assert(cur.end == I.end);
            assert(I.end > it->first.end);
            // we handled this interval, move further
            ++it;

            // nothing else to handle...
            if (it == _mapping.end()) {
                if (cur.start <= cur.end)
                    return {cur};
            }
        }

        while (true) {
            assert(cur.start <= it->first.start);
            if (cur.start != it->first.start && cur.start < it->first.start) {
                assert(it->first.start != 0 && "Underflow");
                ret.push_back(IntervalT{cur.start, it->first.start - 1});
            }
            // does the rest of the interval covers all?
            if (it->first.end >= I.end)
                break;

            assert(it->first.end != (~static_cast<IntervalValueT>(0)) &&
                   "Overflow");
            cur.start = it->first.end + 1;
            assert(cur.end == I.end);

            ++it;
            if (it == end()) {
                if (cur.start <= cur.end)
                    ret.push_back(cur);
                // we're done here
                break;
            }
        }

        return ret;
    }